

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

upb_MapInsertStatus
upb_Map_Insert(upb_Map *map,upb_MessageValue key,upb_MessageValue val,upb_Arena *arena)

{
  upb_MapInsertStatus uVar1;
  upb_Arena *arena_local;
  upb_Map *map_local;
  upb_MessageValue val_local;
  upb_MessageValue key_local;
  
  val_local.int64_val = val.str_val.size;
  map_local = val.map_val;
  key_local.int64_val = key.str_val.size;
  val_local.str_val.size = key._0_8_;
  if (arena != (upb_Arena *)0x0) {
    uVar1 = _upb_Map_Insert(map,&val_local.str_val.size,(long)map->key_size,&map_local,
                            (long)map->val_size,arena);
    return uVar1;
  }
  __assert_fail("arena",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/map.c"
                ,0x46,
                "upb_MapInsertStatus upb_Map_Insert(upb_Map *, upb_MessageValue, upb_MessageValue, upb_Arena *)"
               );
}

Assistant:

upb_MapInsertStatus upb_Map_Insert(upb_Map* map, upb_MessageValue key,
                                   upb_MessageValue val, upb_Arena* arena) {
  UPB_ASSERT(arena);
  return (upb_MapInsertStatus)_upb_Map_Insert(map, &key, map->key_size, &val,
                                              map->val_size, arena);
}